

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitRefNull(PrintExpressionContents *this,RefNull *curr)

{
  HeapType type;
  string_view str;
  
  str._M_str = "ref.null ";
  str._M_len = 9;
  printMedium(this->o,str);
  type = wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.
                     type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitRefNull(RefNull* curr) {
    printMedium(o, "ref.null ");
    printHeapTypeName(curr->type.getHeapType());
  }